

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O3

void uWS::WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::consume
               (char *src,uint length,WebSocketState<true> *wState,void *user)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  uint local_34;
  byte *local_30;
  
  bVar4 = *(byte *)&wState->state;
  uVar5 = bVar4 >> 1 & 0xf;
  local_34 = length;
  local_30 = (byte *)src;
  if ((bVar4 >> 1 & 0xf) != 0) {
    local_30 = (byte *)(src + -(ulong)uVar5);
    length = length + uVar5;
    local_34 = length;
    memcpy(local_30,(wState->state).spill,(ulong)uVar5);
    bVar4 = *(byte *)&wState->state;
  }
  if (((bVar4 & 1) != 0) ||
     (bVar2 = consumeContinuation((char **)&local_30,&local_34,wState,user), length = local_34,
     bVar2)) {
    if (5 < length) {
      do {
        bVar4 = *local_30;
        if ((bVar4 & 0x40) != 0) {
          lVar3 = us_socket_ext(1,user);
          if (*(char *)(lVar3 + 0x5d) != '\x01') goto LAB_0014c598;
          *(undefined1 *)(lVar3 + 0x5d) = 2;
          bVar4 = *local_30;
        }
        if ((bVar4 & 0x30) != 0) {
LAB_0014c598:
          us_socket_close(1,user);
          return;
        }
        if ((bVar4 & 0xf) < 3) {
          bVar4 = local_30[1];
        }
        else if (((-1 < (char)bVar4) || (2 < (byte)((bVar4 & 0xf) - 8))) ||
                (bVar4 = local_30[1], (~bVar4 & 0x7e) == 0)) goto LAB_0014c598;
        bVar4 = bVar4 & 0x7f;
        if (bVar4 < 0x7e) {
          bVar2 = WebSocketProtocol<true,uWS::WebSocketContext<true,true>>::
                  consumeMessage<6u,unsigned_char>(bVar4,(char **)&local_30,&local_34,wState,user);
        }
        else {
          length = local_34;
          if (bVar4 == 0x7e) {
            if (local_34 < 8) break;
            bVar2 = WebSocketProtocol<true,uWS::WebSocketContext<true,true>>::
                    consumeMessage<8u,unsigned_short>
                              (*(ushort *)(local_30 + 2) << 8 | *(ushort *)(local_30 + 2) >> 8,
                               (char **)&local_30,&local_34,wState,user);
          }
          else {
            if (local_34 < 0xe) break;
            uVar1 = *(ulong *)(local_30 + 2);
            bVar2 = WebSocketProtocol<true,uWS::WebSocketContext<true,true>>::
                    consumeMessage<14u,unsigned_long>
                              (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                               (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                               (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                               (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38,(char **)&local_30,&local_34
                               ,wState,user);
          }
        }
        if (bVar2 != false) {
          return;
        }
        length = local_34;
      } while (5 < local_34);
    }
    if (length != 0) {
      memcpy((wState->state).spill,local_30,(ulong)length);
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe1 | (char)length * '\x02';
    }
  }
  return;
}

Assistant:

static inline void consume(char *src, unsigned int length, WebSocketState<isServer> *wState, void *user) {
        if (wState->state.spillLength) {
            src -= wState->state.spillLength;
            length += wState->state.spillLength;
            memcpy(src, wState->state.spill, wState->state.spillLength);
        }
        if (wState->state.wantsHead) {
            parseNext:
            while (length >= SHORT_MESSAGE_HEADER) {

                // invalid reserved bits / invalid opcodes / invalid control frames / set compressed frame
                if ((rsv1(src) && !Impl::setCompressed(wState, user)) || rsv23(src) || (getOpCode(src) > 2 && getOpCode(src) < 8) ||
                    getOpCode(src) > 10 || (getOpCode(src) > 2 && (!isFin(src) || payloadLength(src) > 125))) {
                    Impl::forceClose(wState, user);
                    return;
                }

                if (payloadLength(src) < 126) {
                    if (consumeMessage<SHORT_MESSAGE_HEADER, uint8_t>(payloadLength(src), src, length, wState, user)) {
                        return;
                    }
                } else if (payloadLength(src) == 126) {
                    if (length < MEDIUM_MESSAGE_HEADER) {
                        break;
                    } else if(consumeMessage<MEDIUM_MESSAGE_HEADER, uint16_t>(protocol::cond_byte_swap<uint16_t>(protocol::bit_cast<uint16_t>(src + 2)), src, length, wState, user)) {
                        return;
                    }
                } else if (length < LONG_MESSAGE_HEADER) {
                    break;
                } else if (consumeMessage<LONG_MESSAGE_HEADER, uint64_t>(protocol::cond_byte_swap<uint64_t>(protocol::bit_cast<uint64_t>(src + 2)), src, length, wState, user)) {
                    return;
                }
            }
            if (length) {
                memcpy(wState->state.spill, src, length);
                wState->state.spillLength = length & 0xf;
            }
        } else if (consumeContinuation(src, length, wState, user)) {
            goto parseNext;
        }
    }